

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorUtilTest.cpp
# Opt level: O2

void __thiscall jaegertracing::utils::ErrorUtil_test_Test::TestBody(ErrorUtil_test_Test *this)

{
  error_category *__ecat;
  runtime_error *this_00;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  runtime_error stdEx;
  TestLogger logger;
  Exception transportEx;
  system_error sysEx;
  ostringstream oss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  logger._message._M_dataplus._M_p = (pointer)&logger._message.field_2;
  logger.super_Logger._vptr_Logger = (_func_int **)&PTR__TestLogger_00222698;
  logger._message._M_string_length = 0;
  logger._message.field_2._M_local_buf[0] = '\0';
  std::runtime_error::runtime_error(&stdEx,"runtime error");
  __ecat = (error_category *)std::_V2::generic_category();
  std::system_error::system_error(&sysEx,-1,__ecat);
  std::__cxx11::string::string((string *)&gtest_ar,"test",(allocator *)&gtest_ar_);
  Sender::Exception::Exception(&transportEx,(string *)&gtest_ar,5);
  std::__cxx11::string::~string((string *)&gtest_ar);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,&stdEx);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(ErrorUtil, test)
{
    std::ostringstream oss;
    TestLogger logger;
    std::runtime_error stdEx("runtime error");
    std::system_error sysEx(-1, std::generic_category());
    Sender::Exception transportEx("test", 5);
    for (auto i = 0; i < 4; ++i) {
        try {
            switch (i) {
            case 0:
                throw stdEx;
            case 1:
                throw sysEx;
            case 2:
                throw transportEx;
            default:
                ASSERT_EQ(3, i);
                throw 5;
            }
        } catch (...) {
            ErrorUtil::logError(logger, "test");
            switch (i) {
            case 0: {
                ASSERT_EQ("test: runtime error", logger.str());
            } break;
            case 1: {
                ASSERT_TRUE(endsWith(logger.str(), ", code=-1"));
            } break;
            case 2: {
                ASSERT_EQ("test: test, numFailed=5", logger.str());
            } break;
            default: {
                ASSERT_EQ(3, i);
                ASSERT_EQ("test", logger.str());
            } break;
            }
        }
    }
}